

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O0

void start_iterator(dmr_C *C,statement *stmt)

{
  symbol *sym;
  symbol *sym_00;
  symbol *brk;
  symbol *cont;
  statement *stmt_local;
  dmr_C *C_local;
  
  dmrC_start_symbol_scope(C);
  sym = dmrC_alloc_symbol(C->S,stmt->pos,3);
  dmrC_bind_symbol(C->S,sym,C->S->continue_ident,NS_ITERATOR);
  sym_00 = dmrC_alloc_symbol(C->S,stmt->pos,3);
  dmrC_bind_symbol(C->S,sym_00,C->S->break_ident,NS_ITERATOR);
  stmt->type = STMT_ITERATOR;
  (stmt->field_2).field_5.label_identifier = sym_00;
  (stmt->field_2).field_2.ret_target = sym;
  fn_local_symbol(C,sym_00);
  fn_local_symbol(C,sym);
  return;
}

Assistant:

static void start_iterator(struct dmr_C *C, struct statement *stmt)
{
	struct symbol *cont, *brk;

	dmrC_start_symbol_scope(C);
	cont = dmrC_alloc_symbol(C->S, stmt->pos, SYM_NODE);
	dmrC_bind_symbol(C->S, cont, C->S->continue_ident, NS_ITERATOR);
	brk = dmrC_alloc_symbol(C->S, stmt->pos, SYM_NODE);
	dmrC_bind_symbol(C->S, brk, C->S->break_ident, NS_ITERATOR);

	stmt->type = STMT_ITERATOR;
	stmt->iterator_break = brk;
	stmt->iterator_continue = cont;
	fn_local_symbol(C, brk);
	fn_local_symbol(C, cont);
}